

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O1

void __thiscall
amrex::FArrayBox::FArrayBox(FArrayBox *this,Box *b,int n,bool alloc,bool shared,Arena *ar)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  (this->super_BaseFab<double>).super_DataAllocator.m_arena = ar;
  (this->super_BaseFab<double>)._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00837b90;
  (this->super_BaseFab<double>).dptr = (double *)0x0;
  uVar1 = *(undefined8 *)((b->smallend).vect + 2);
  uVar2 = *(undefined8 *)(b->bigend).vect;
  uVar3 = *(undefined8 *)((b->bigend).vect + 2);
  *(undefined8 *)(this->super_BaseFab<double>).domain.smallend.vect =
       *(undefined8 *)(b->smallend).vect;
  *(undefined8 *)((this->super_BaseFab<double>).domain.smallend.vect + 2) = uVar1;
  *(undefined8 *)(this->super_BaseFab<double>).domain.bigend.vect = uVar2;
  *(undefined8 *)((this->super_BaseFab<double>).domain.bigend.vect + 2) = uVar3;
  (this->super_BaseFab<double>).nvar = n;
  (this->super_BaseFab<double>).truesize = 0;
  (this->super_BaseFab<double>).ptr_owner = false;
  (this->super_BaseFab<double>).shared_memory = shared;
  if (alloc && !shared) {
    BaseFab<double>::define(&this->super_BaseFab<double>);
  }
  (this->super_BaseFab<double>)._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00837ce0;
  *(undefined4 *)&(this->super_BaseFab<double>).field_0x44 = 0;
  if (alloc) {
    initVal(this);
    return;
  }
  return;
}

Assistant:

FArrayBox::FArrayBox (const Box& b, int n, bool alloc, bool shared, Arena* ar)
    : BaseFab<Real>(b,n,alloc,shared,ar)
{
    if (alloc) initVal();
}